

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Https_server::Https_server
          (Https_server *this,Inet_addr *bind_addr,Executor_factory_base *ef)

{
  Server_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *pSVar1;
  Reactor_base *r;
  Executor_factory_base *ef_local;
  Inet_addr *bind_addr_local;
  Https_server *this_local;
  
  pSVar1 = (Server_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *)
           operator_new(0x18);
  Server_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection>::Server_conn_factory
            (pSVar1);
  Server::Server(&this->super_Server,bind_addr,(Accepted_conn_factory *)pSVar1,ef);
  (this->super_Server)._vptr_Server = (_func_int **)&PTR__Https_server_00253cb0;
  pSVar1 = (Server_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *)
           Server::get_conn_factory(&this->super_Server);
  r = Server::get_reactor(&this->super_Server);
  Server_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection>::post_init
            (pSVar1,&this->super_Server,r);
  return;
}

Assistant:

Https_server::Https_server(const iqnet::Inet_addr& bind_addr, Executor_factory_base* ef):
  Server(bind_addr, new Https_conn_factory, ef)
{
  static_cast<Https_conn_factory*>(get_conn_factory())->post_init(this, get_reactor());
}